

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_edit_buffer(nk_context *ctx,nk_flags flags,nk_text_edit *edit,nk_plugin_filter filter)

{
  uchar uVar1;
  uint uVar2;
  nk_window *pnVar3;
  nk_context *local_80;
  nk_plugin_filter local_78;
  nk_context *local_70;
  nk_hash hash;
  undefined1 auStack_5c [3];
  uchar prev_state;
  nk_flags ret_flags;
  nk_rect bounds;
  nk_widget_layout_states state;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  nk_plugin_filter filter_local;
  nk_text_edit *edit_local;
  nk_flags flags_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5bae,
                  "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
                 );
  }
  if (edit == (nk_text_edit *)0x0) {
    __assert_fail("edit",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5baf,
                  "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5bb0,
                  "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5bb1,
                  "nk_flags nk_edit_buffer(struct nk_context *, nk_flags, struct nk_text_edit *, nk_plugin_filter)"
                 );
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar3 = ctx->current;
    bounds.w = (float)nk_widget((nk_rect *)auStack_5c,ctx);
    if (bounds.w == 0.0) {
      ctx_local._4_4_ = 0;
    }
    else {
      local_70 = ctx;
      if ((pnVar3->layout->flags & 0x1000) != 0) {
        local_70 = (nk_context *)0x0;
      }
      uVar2 = (pnVar3->edit).seq;
      (pnVar3->edit).seq = uVar2 + 1;
      if (((pnVar3->edit).active == 0) || (uVar2 != (pnVar3->edit).name)) {
        edit->active = '\0';
      }
      else {
        if ((flags & 0x10) != 0) {
          edit->cursor = (edit->string).len;
        }
        if ((flags & 0x20) == 0) {
          edit->select_start = edit->cursor;
          edit->select_end = edit->cursor;
        }
        if ((flags & 0x40) != 0) {
          (edit->clip).userdata = (ctx->clip).userdata;
          (edit->clip).paste = (ctx->clip).paste;
          (edit->clip).copy = (ctx->clip).copy;
        }
        edit->active = (uchar)(pnVar3->edit).active;
      }
      edit->mode = (pnVar3->edit).mode;
      local_78 = filter;
      if (filter == (nk_plugin_filter)0x0) {
        local_78 = nk_filter_default;
      }
      uVar1 = edit->active;
      if ((flags & 1) == 0) {
        local_80 = local_70;
      }
      else {
        local_80 = (nk_context *)0x0;
      }
      stack0xffffffffffffffb8 = local_80;
      ctx_local._4_4_ =
           nk_do_edit(&ctx->last_widget_state,&pnVar3->buffer,_auStack_5c,flags,local_78,edit,
                      &(ctx->style).edit,&local_80->input,(ctx->style).font);
      if ((ctx->last_widget_state & 0x10) != 0) {
        (ctx->style).cursor_active = (ctx->style).cursors[1];
      }
      if ((edit->active == '\0') || (uVar1 == edit->active)) {
        if ((uVar1 != '\0') && (edit->active == '\0')) {
          (pnVar3->edit).active = 0;
        }
      }
      else {
        (pnVar3->edit).active = 1;
        (pnVar3->edit).name = uVar2;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API nk_flags
nk_edit_buffer(struct nk_context *ctx, nk_flags flags,
    struct nk_text_edit *edit, nk_plugin_filter filter)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    nk_flags ret_flags = 0;
    unsigned char prev_state;
    nk_hash hash;

    /* make sure correct values */
    NK_ASSERT(ctx);
    NK_ASSERT(edit);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    state = nk_widget(&bounds, ctx);
    if (!state) return state;
    in = (win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    /* check if edit is currently hot item */
    hash = win->edit.seq++;
    if (win->edit.active && hash == win->edit.name) {
        if (flags & NK_EDIT_NO_CURSOR)
            edit->cursor = edit->string.len;
        if (!(flags & NK_EDIT_SELECTABLE)) {
            edit->select_start = edit->cursor;
            edit->select_end = edit->cursor;
        }
        if (flags & NK_EDIT_CLIPBOARD)
            edit->clip = ctx->clip;
        edit->active = (unsigned char)win->edit.active;
    } else edit->active = nk_false;
    edit->mode = win->edit.mode;

    filter = (!filter) ? nk_filter_default: filter;
    prev_state = (unsigned char)edit->active;
    in = (flags & NK_EDIT_READ_ONLY) ? 0: in;
    ret_flags = nk_do_edit(&ctx->last_widget_state, &win->buffer, bounds, flags,
                    filter, edit, &style->edit, in, style->font);

    if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
        ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_TEXT];
    if (edit->active && prev_state != edit->active) {
        /* current edit is now hot */
        win->edit.active = nk_true;
        win->edit.name = hash;
    } else if (prev_state && !edit->active) {
        /* current edit is now cold */
        win->edit.active = nk_false;
    } return ret_flags;
}